

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O1

bool wasm::optimizeBlock(Block *curr,Module *module,PassOptions *passOptions,
                        BranchSeekerCache *branchInfo)

{
  Id IVar1;
  Block *pBVar2;
  long lVar3;
  size_t sVar4;
  Module *pMVar5;
  bool bVar6;
  undefined1 uVar7;
  undefined1 extraout_AL;
  undefined7 uVar12;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this;
  const_iterator cVar8;
  ulong uVar9;
  Expression **ppEVar10;
  Drop *this_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar11;
  Expression *pEVar13;
  Expression *pEVar14;
  uint uVar15;
  long lVar16;
  SmallVector<wasm::Expression_*,_10UL> *pSVar17;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  Block *pBVar23;
  SmallVector<wasm::Expression_*,_10UL> *pSVar24;
  Block *block;
  uint uVar25;
  bool bVar26;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Name target;
  undefined1 local_138 [8];
  SmallVector<wasm::Expression_*,_10UL> merged;
  Builder builder;
  Block *local_98;
  Expression *child;
  MixedArena *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *local_68;
  ulong local_60;
  Block *local_58;
  Expression *local_50;
  Expression *local_48;
  Block *local_40;
  Expression *local_38;
  Expression *pEVar18;
  
  local_68 = (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&curr->list;
  local_88 = &module->allocator;
  local_70 = 0;
  merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)passOptions;
  child = (Expression *)branchInfo;
  local_58 = curr;
  do {
    if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements == 0) {
      uVar21 = 0;
    }
    else {
      lVar16 = 8;
      local_78 = 0;
      uVar20 = 0;
      do {
        pBVar23 = (Block *)0x0;
        local_98 = *(Block **)(*(long *)local_68 + uVar20 * 8);
        block = local_98;
        if ((((SpecificExpression<(wasm::Expression::Id)18> *)
             &local_98->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id !=
            BlockId) {
          block = pBVar23;
        }
        if (block == (Block *)0x0) {
          pBVar2 = *(Block **)(*(long *)local_68 + uVar20 * 8);
          IVar1 = (((SpecificExpression<(wasm::Expression::Id)18> *)
                   &pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).
                  _id;
          if (IVar1 == DropId) {
            block = (Block *)(pBVar2->name).super_IString.str._M_len;
            if ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
                BlockId) {
              block = pBVar23;
            }
            if ((block == (Block *)0x0) ||
               (bVar6 = optimizeDroppedBlock
                                  ((Drop *)pBVar2,block,module,
                                   (PassOptions *)
                                   merged.flexible.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (BranchSeekerCache *)child), !bVar6)) {
LAB_0096afdc:
              local_40 = (Block *)0x0;
              block = (Block *)0x0;
            }
            else {
              if ((curr->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements <= uVar20) {
LAB_0096b506:
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              lVar3 = *(long *)local_68;
              *(Block **)(lVar3 + uVar20 * 8) = block;
              uVar12 = (undefined7)((ulong)lVar3 >> 8);
              local_70 = CONCAT71(uVar12,1);
              local_40 = (Block *)0x0;
              local_78 = CONCAT71(uVar12,1);
              local_98 = block;
            }
          }
          else {
            local_40 = pBVar2;
            if (IVar1 != LoopId) {
              local_40 = pBVar23;
            }
            if (local_40 == (Block *)0x0) goto LAB_0096afdc;
            block = (Block *)(local_40->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             .data;
            if ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
                BlockId) {
              block = pBVar23;
            }
          }
        }
        else {
          local_40 = (Block *)0x0;
        }
        bVar6 = true;
        if ((block != (Block *)0x0) &&
           (local_38 = (Expression *)
                       (block->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements, local_38 != (Expression *)0x0)) {
          uVar21 = (block->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements;
          bVar26 = 1 < uVar21;
          if ((bVar26) &&
             (ppEVar10 = (block->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         data, ((*ppEVar10)->type).id != 1)) {
            uVar9 = 2;
            do {
              uVar19 = uVar9;
              if (uVar21 == uVar19) break;
              uVar9 = uVar19 + 1;
            } while ((ppEVar10[uVar19 - 1]->type).id != 1);
            bVar26 = uVar19 < uVar21;
          }
          if (!bVar26) {
            local_80 = lVar16;
            local_60 = uVar20;
            if ((block->name).super_IString.str._M_str == (char *)0x0) {
              pEVar14 = (Expression *)0x0;
              uVar21 = (ulong)local_38 & 0xffffffff;
LAB_0096b0f9:
              uVar15 = (uint)uVar21;
              if (local_40 != (Block *)0x0) {
                local_50 = (Expression *)(local_40->name).super_IString.str._M_len;
                local_48 = (Expression *)(local_40->name).super_IString.str._M_str;
                uVar20 = (ulong)local_38 & 0xffffffff;
                pEVar18 = (Expression *)((ulong)local_38 & 0xffffffff);
                do {
                  uVar15 = (uint)uVar21;
                  uVar20 = uVar20 - 1;
                  if ((int)(uint)uVar20 < 0) break;
                  uVar9 = (ulong)((uint)uVar20 & 0x7fffffff);
                  if ((block->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      usedElements <= uVar9) goto LAB_0096b506;
                  ppEVar10 = (block->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             .data;
                  target.super_IString.str._M_str = (char *)ppEVar10;
                  target.super_IString.str._M_len = (size_t)local_48;
                  bVar6 = BranchUtils::BranchSeeker::has
                                    ((BranchSeeker *)ppEVar10[uVar9],local_50,target);
                  pEVar13 = pEVar18;
                  if ((uint)pEVar18 <= (uint)pEVar14) {
                    pEVar13 = pEVar14;
                  }
                  pEVar18 = (Expression *)(ulong)((uint)pEVar18 - 1);
                  if (bVar6) {
                    uVar21 = 0;
                    pEVar14 = pEVar13;
                  }
                  uVar15 = (uint)uVar21;
                } while (!bVar6);
                if (pEVar14 < local_38) {
                  sVar4 = (block->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
                  if (sVar4 == 0) {
                    __assert_fail("usedElements > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                  ,0xd0,
                                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                 );
                  }
                  if (((block->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       data[sVar4 - 1]->type).id < 2) goto LAB_0096b1a5;
                  iVar22 = 6;
                  bVar6 = false;
                }
                else {
LAB_0096b1a5:
                  iVar22 = 0;
                  bVar6 = true;
                }
                curr = local_58;
                if (!bVar6) goto LAB_0096b4a6;
              }
              uVar25 = (uint)pEVar14;
              if ((uVar15 != 0) || (iVar22 = 6, curr = local_58, local_38 != pEVar14)) {
                local_138 = (undefined1  [8])0x0;
                merged.flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                merged.fixed._M_elems[9] = (Expression *)0x0;
                merged.flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_48 = pEVar14;
                if (local_60 != 0) {
                  lVar16 = 0;
                  uVar21 = 0;
                  do {
                    if ((local_58->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements <= uVar21) goto LAB_0096b506;
                    SmallVector<wasm::Expression_*,_10UL>::push_back
                              ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
                               (Expression **)(*(long *)local_68 + lVar16));
                    uVar21 = uVar21 + 1;
                    lVar16 = lVar16 + 8;
                  } while (local_60 != uVar21);
                }
                if (uVar15 != 0) {
                  local_50 = (Expression *)(ulong)uVar15;
                  lVar16 = 0;
                  uVar21 = 0;
                  do {
                    if ((block->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements <= uVar21) goto LAB_0096b506;
                    SmallVector<wasm::Expression_*,_10UL>::push_back
                              ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
                               (Expression **)
                               ((long)(block->list).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                      .data + lVar16));
                    uVar21 = uVar21 + 1;
                    lVar16 = lVar16 + 8;
                  } while ((int)local_50 != (int)uVar21);
                }
                lVar16 = local_80;
                uVar21 = local_60;
                pBVar23 = local_58;
                if (uVar15 < uVar25) {
                  SmallVector<wasm::Expression_*,_10UL>::push_back
                            ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
                             (Expression **)&local_98);
                  builder.wasm = (Module *)0x0;
                  iVar22 = uVar25 - uVar15;
                  pBVar2 = local_58;
                  pEVar18 = local_48;
                  pEVar13 = local_38;
                  if (uVar15 <= uVar25 && iVar22 != 0) {
                    uVar21 = (ulong)uVar15;
                    do {
                      if ((block->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements <= uVar21) goto LAB_0096b506;
                      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      push_back((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 *)&builder,
                                (block->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                .data[uVar21]);
                      uVar21 = uVar21 + 1;
                      iVar22 = iVar22 + -1;
                      pBVar2 = local_58;
                      pEVar18 = local_48;
                      pEVar13 = local_38;
                    } while (iVar22 != 0);
                  }
                  while (pEVar14 = local_38, pBVar23 = local_58, local_58 = pBVar2,
                        pEVar18 < local_38) {
                    uVar25 = uVar25 + 1;
                    local_38 = pEVar13;
                    if ((Expression *)
                        (block->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements <= pEVar18) goto LAB_0096b506;
                    SmallVector<wasm::Expression_*,_10UL>::push_back
                              ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
                               (block->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               .data + (long)pEVar18);
                    pBVar2 = local_58;
                    pEVar18 = (Expression *)(ulong)uVar25;
                    pEVar13 = local_38;
                    local_38 = pEVar14;
                    local_58 = pBVar23;
                  }
                  pMVar5 = (Module *)
                           (block->list).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .data;
                  (block->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
                       (Expression **)builder.wasm;
                  (block->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements = 0;
                  (block->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  allocatedElements = 0;
                  pEVar14 = (Expression *)0x0;
                  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_payload =
                       (_Storage<wasm::Type,_true>)pEVar18;
                  builder.wasm = pMVar5;
                  local_38 = pEVar13;
                  Block::finalize(block,type_,Unknown);
                  lVar16 = local_80;
                  uVar21 = local_60;
                  if (local_40 != (Block *)0x0) {
                    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload =
                         (_Storage<wasm::Type,_true>)pEVar18;
                    Loop::finalize((Loop *)local_40,type__00);
                    lVar16 = local_80;
                    uVar21 = local_60;
                  }
                }
                while (uVar21 + 1 <
                       (pBVar23->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements) {
                  SmallVector<wasm::Expression_*,_10UL>::push_back
                            ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
                             (Expression **)(lVar16 + *(long *)local_68));
                  lVar16 = lVar16 + 8;
                  uVar21 = uVar21 + 1;
                }
                if ((Id *)local_138 +
                    ((long)merged.flexible.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                     (long)merged.fixed._M_elems[9] >> 3) != (Id *)0x0) {
                  ppEVar10 = SmallVector<wasm::Expression_*,_10UL>::back
                                       ((SmallVector<wasm::Expression_*,_10UL> *)local_138);
                  pEVar14 = (Expression *)
                            ((Id *)local_138 +
                            ((long)merged.flexible.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start -
                             (long)merged.fixed._M_elems[9] >> 3));
                  local_38 = pEVar14;
                  if (pEVar14 != (Expression *)0x0) {
                    local_50 = *ppEVar10;
                    lVar16 = -0x50;
                    pSVar24 = &merged;
                    uVar21 = 0;
                    do {
                      pSVar17 = (SmallVector<wasm::Expression_*,_10UL> *)
                                (&merged.fixed._M_elems[9]->_id + lVar16);
                      if (uVar21 < 10) {
                        pSVar17 = pSVar24;
                      }
                      pEVar18 = (Expression *)pSVar17->usedFixed;
                      if ((pEVar18 != local_50) && (1 < (pEVar18->type).id)) {
                        local_48 = pEVar18;
                        this_00 = (Drop *)MixedArena::allocSpace(local_88,0x18,8);
                        (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).
                        super_Expression._id = DropId;
                        (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).
                        super_Expression.type.id = 0;
                        this_00->value = local_48;
                        Drop::finalize(this_00);
                        pSVar17->usedFixed = (size_t)this_00;
                      }
                      uVar21 = uVar21 + 1;
                      pSVar24 = (SmallVector<wasm::Expression_*,_10UL> *)&pSVar24->fixed;
                      lVar16 = lVar16 + 8;
                    } while (local_38 != (Expression *)uVar21);
                  }
                }
                ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
                set<wasm::SmallVector<wasm::Expression*,10ul>>
                          (local_68,(SmallVector<wasm::Expression_*,_10UL> *)local_138);
                curr = local_58;
                uVar11 = extraout_RAX;
                if (merged.fixed._M_elems[9] != (Expression *)0x0) {
                  operator_delete(merged.fixed._M_elems[9],
                                  (long)merged.flexible.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)merged.fixed._M_elems[9]);
                  uVar11 = extraout_RAX_00;
                }
                local_70 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
                iVar22 = 4;
                local_78 = CONCAT71((int7)((ulong)pEVar14 >> 8),1);
              }
            }
            else {
              iVar22 = 6;
              if ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                  id < 2) {
                local_50 = (Expression *)(block->name).super_IString.str._M_len;
                local_48 = (Expression *)(block->name).super_IString.str._M_str;
                uVar20 = 0;
                uVar21 = (ulong)local_38 & 0xffffffff;
                pEVar14 = (Expression *)0x0;
                do {
                  if ((block->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      usedElements <= uVar20) goto LAB_0096b506;
                  local_138 = (undefined1  [8])local_50;
                  merged.usedFixed = (size_t)local_48;
                  this = &BranchUtils::BranchSeekerCache::getBranches
                                    ((BranchSeekerCache *)child,
                                     (block->list).
                                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     .data[uVar20])->_M_t;
                  cVar8 = std::
                          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          ::find(this,(key_type *)local_138);
                  if ((_Rb_tree_header *)cVar8._M_node != &(this->_M_impl).super__Rb_tree_header) {
                    pEVar14 = (Expression *)((ulong)local_38 & 0xffffffff);
                    uVar21 = uVar20 & 0xffffffff;
                    break;
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 < local_38);
                goto LAB_0096b0f9;
              }
            }
LAB_0096b4a6:
            bVar6 = iVar22 == 6;
            lVar16 = local_80;
            uVar20 = local_60;
          }
        }
        uVar21 = local_78;
        if (!bVar6) break;
        uVar20 = uVar20 + 1;
        lVar16 = lVar16 + 8;
      } while (uVar20 < (curr->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements);
    }
    uVar7 = (undefined1)uVar21;
    if ((uVar21 & 1) == 0) {
      if ((local_70 & 1) != 0) {
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)
             (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
        Block::finalize(curr,type__01,Unknown);
        uVar7 = extraout_AL;
      }
      return (bool)uVar7;
    }
  } while( true );
}

Assistant:

static bool optimizeBlock(Block* curr,
                          Module* module,
                          PassOptions& passOptions,
                          BranchUtils::BranchSeekerCache& branchInfo) {
  auto& list = curr->list;
  // Main merging loop.
  bool more = true;
  bool changed = false;
  while (more) {
    more = false;
    for (size_t i = 0; i < list.size(); i++) {
      auto* child = list[i];
      // The child block, if there is one.
      Block* childBlock = child->dynCast<Block>();
      // If we are merging an inner block of a loop, then we must not
      // merge things before and including the name of the loop, moving
      // those out would break things.
      Loop* loop = nullptr;
      // To to handle a non-block child.
      if (!childBlock) {
        // If we have a child that is (drop (block ..)) then we can move the
        // drop into the block, and remove br values. This allows more merging.
        if (auto* drop = list[i]->dynCast<Drop>()) {
          childBlock = drop->value->dynCast<Block>();
          if (childBlock &&
              optimizeDroppedBlock(
                drop, childBlock, *module, passOptions, branchInfo)) {
            child = list[i] = childBlock;
            more = true;
            changed = true;
          } else {
            childBlock = nullptr;
          }
        } else if ((loop = list[i]->dynCast<Loop>())) {
          // We can merge a loop's "tail" - if the body is a block and has
          // instructions at the end that do not branch back.
          childBlock = loop->body->dynCast<Block>();
          // TODO: handle (loop (loop - the bodies of loops may not be blocks
        }
      }
      // If no block, we can't do anything.
      if (!childBlock) {
        continue;
      }
      auto& childList = childBlock->list;
      auto childSize = childList.size();
      if (childSize == 0) {
        continue;
      }
      // If the child has items after an unreachable, ignore it - dce should
      // have been run, and we prefer to not handle the complexity here.
      if (hasDeadCode(childBlock)) {
        continue;
      }
      // In some cases we can remove only the head or the tail of the block,
      // and must keep some things in the child block.
      Index keepStart = childSize;
      Index keepEnd = 0;
      // For a block with a name, we may only be able to remove a head, up
      // to the first item that branches to the block.
      if (childBlock->name.is()) {
        // If it has a concrete value, then breaks may be sending it a value,
        // and we'd need to handle that. TODO
        if (childBlock->type.isConcrete()) {
          continue;
        }
        auto childName = childBlock->name;
        for (size_t j = 0; j < childSize; j++) {
          auto* item = childList[j];
          if (branchInfo.hasBranch(item, childName)) {
            // We can't remove this from the child.
            keepStart = j;
            keepEnd = childSize;
            break;
          }
        }
      }
      // For a loop, we may only be able to remove a tail
      if (loop) {
        auto childName = loop->name;
        for (auto j = int(childSize - 1); j >= 0; j--) {
          auto* item = childList[j];
          if (BranchUtils::BranchSeeker::has(item, childName)) {
            // We can't remove this from the child.
            keepStart = 0;
            keepEnd = std::max(Index(j + 1), keepEnd);
            break;
          }
        }
        // If we can only do part of the block, and if the block has a flowing
        // value, we would need special handling for that - not worth it,
        // probably TODO
        // FIXME is this not handled by the drop later down?
        if (keepEnd < childSize && childList.back()->type.isConcrete()) {
          continue;
        }
      }
      // Maybe there's nothing to do, if we must keep it all in the
      // child anyhow.
      if (keepStart == 0 && keepEnd == childSize) {
        continue;
      }
      // There is something to do!
      bool keepingPart = keepStart < keepEnd;
      // Create a new merged list, and fill in the code before the child block
      // we are merging in. It is efficient to use a small vector here because
      // most blocks are fairly small, and this way we copy once into the arena
      // we use for Block lists a single time at the end (arena allocations
      // can't be freed, so any temporary allocations while we add to the list
      // would end up wasted).
      SmallVector<Expression*, 10> merged;
      for (size_t j = 0; j < i; j++) {
        merged.push_back(list[j]);
      }
      // Add the head of the block - the things at the start we do
      // not need to keep.
      for (Index j = 0; j < keepStart; j++) {
        merged.push_back(childList[j]);
      }
      // If we can't merge it all, keep and filter the child.
      if (keepingPart) {
        merged.push_back(child);
        // Filter the child.
        ExpressionList filtered(module->allocator);
        for (Index j = keepStart; j < keepEnd; j++) {
          filtered.push_back(childList[j]);
        }
        // Add the tail of the block - the things at the end we do
        // not need to keep.
        for (Index j = keepEnd; j < childSize; j++) {
          merged.push_back(childList[j]);
        }
        // Update the child.
        childList.swap(filtered);
        // We may have removed unreachable items.
        childBlock->finalize();
        if (loop) {
          loop->finalize();
        }
        // Note that we modify the child block here, which invalidates info
        // in branchInfo. However, as we have scanned the parent, we have
        // already forgotten the child's info, so there is nothing to do here
        // for the child.
        // (We also don't need to do anything for the parent - we move code
        // from a child into the parent, but that doesn't change the total
        // branches in the parent.)
      }
      // Add the rest of the parent block after the child.
      for (size_t j = i + 1; j < list.size(); j++) {
        merged.push_back(list[j]);
      }
      // if we merged a concrete element in the middle, drop it
      if (!merged.empty()) {
        auto* last = merged.back();
        for (auto*& item : merged) {
          if (item != last && item->type.isConcrete()) {
            Builder builder(*module);
            item = builder.makeDrop(item);
          }
        }
      }
      list.set(merged);
      more = true;
      changed = true;
      break;
    }
  }
  if (changed) {
    curr->finalize(curr->type);
  }
  return changed;
}